

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

Node * __thiscall
MarkerIndex::Iterator::insert_splice_boundary(Iterator *this,Point *position,bool is_insertion_end)

{
  int iVar1;
  int comparison;
  bool is_insertion_end_local;
  Point *position_local;
  Iterator *this_local;
  
  reset(this);
  while ((iVar1 = Point::compare(position,&this->current_node_position), iVar1 != 0 ||
         (is_insertion_end))) {
    if (iVar1 < 0) {
      if (this->current_node->left == (Node *)0x0) {
        insert_left_child(this,position);
        return this->current_node->left;
      }
      descend_left(this);
    }
    else {
      if (this->current_node->right == (Node *)0x0) {
        insert_right_child(this,position);
        return this->current_node->right;
      }
      descend_right(this);
    }
  }
  return this->current_node;
}

Assistant:

MarkerIndex::Node *MarkerIndex::Iterator::insert_splice_boundary(const Point &position, bool is_insertion_end) {
  reset();

  while (true) {
    int comparison = position.compare(current_node_position);
    if (comparison == 0 && !is_insertion_end) {
      return current_node;
    } else if (comparison < 0) {
      if (current_node->left) {
        descend_left();
      } else {
        insert_left_child(position);
        return current_node->left;
      }
    } else { // comparison > 0
      if (current_node->right) {
        descend_right();
      } else {
        insert_right_child(position);
        return current_node->right;
      }
    }
  }
}